

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_data.cpp
# Opt level: O2

int32_t __thiscall
cornelich::vanilla_data::find_next_data_file_number
          (vanilla_data *this,int32_t cycle,int32_t thread_id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  type_conflict tVar1;
  bool bVar2;
  int iVar3;
  directory_iterator __end1;
  directory_iterator __begin1;
  directory_iterator local_258;
  directory_iterator local_250;
  directory_iterator end;
  directory_iterator begin;
  iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
  local_238;
  string data_prefix;
  int32_t index;
  path path;
  error_code err;
  string_type name;
  
  std::__cxx11::string::string((string *)&name,(string *)this->m_settings);
  cycle_formatter::date_from_cycle_abi_cxx11_
            ((string *)&index,
             (this->m_settings->m_cycle_format).
             super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (long)cycle);
  std::__cxx11::string::string((string *)&data_prefix,(string *)&index);
  boost::filesystem::operator/(&path,(path *)&name,(path *)&data_prefix);
  std::__cxx11::string::~string((string *)&data_prefix);
  std::__cxx11::string::~string((string *)&index);
  std::__cxx11::string::~string((string *)&name);
  err.val_ = 0;
  err.failed_ = false;
  err.cat_ = boost::system::system_category();
  boost::filesystem::directory_iterator::directory_iterator(&begin,&path,&err);
  end.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&name);
  this_00 = &name.field_2;
  std::operator<<((ostream *)this_00->_M_local_buf,(string *)DATA_FILE_NAME_PREFIX_abi_cxx11_);
  std::ostream::operator<<((ostream *)this_00->_M_local_buf,thread_id);
  std::operator<<((ostream *)this_00->_M_local_buf,'-');
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&name);
  local_250 = (directory_iterator)(directory_iterator)begin.m_imp.px;
  if (begin.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)begin.m_imp.px = *(int *)begin.m_imp.px + 1;
    UNLOCK();
  }
  local_258 = (directory_iterator)(directory_iterator)end.m_imp.px;
  if (end.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)end.m_imp.px = *(int *)end.m_imp.px + 1;
    UNLOCK();
  }
  boost::make_iterator_range<boost::filesystem::directory_iterator>
            ((boost *)&local_238,&local_250,&local_258);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_258.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_250.m_imp);
  __begin1.m_imp.px =
       (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
       (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_238.m_Begin;
  if (local_238.m_Begin.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_238.m_Begin.m_imp.px = *(int *)local_238.m_Begin.m_imp.px + 1;
    UNLOCK();
  }
  __end1.m_imp.px =
       (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
       (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_238.m_End;
  if (local_238.m_End.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_238.m_End.m_imp.px = *(int *)local_238.m_End.m_imp.px + 1;
    UNLOCK();
  }
  iVar3 = -1;
  while( true ) {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                        *)&__begin1,
                       (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                        *)&__end1);
    if (!tVar1) break;
    boost::filesystem::directory_iterator::dereference(&__begin1);
    boost::filesystem::path::filename();
    std::__cxx11::string::string((string *)&name,(string *)&index);
    std::__cxx11::string::~string((string *)&index);
    bVar2 = boost::algorithm::
            starts_with<std::__cxx11::string,std::__cxx11::string,boost::algorithm::is_equal>
                      (&name,&data_prefix);
    if (bVar2) {
      index = -1;
      util::parse_number<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(name._M_dataplus._M_p + (int)data_prefix._M_string_length),
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(name._M_dataplus._M_p + name._M_string_length),(int *)&index);
      if (iVar3 <= index) {
        iVar3 = index;
      }
    }
    std::__cxx11::string::~string((string *)&name);
    boost::filesystem::directory_iterator::increment(&__begin1);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&__end1.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&__begin1.m_imp);
  boost::iterator_range_detail::
  iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
  ::~iterator_range_base(&local_238);
  std::__cxx11::string::~string((string *)&data_prefix);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&end.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&begin.m_imp);
  std::__cxx11::string::~string((string *)&path);
  return iVar3 + 1;
}

Assistant:

std::int32_t vanilla_data::find_next_data_file_number(std::int32_t cycle, std::int32_t thread_id) const
{
    std::int32_t last_number = -1;
    const auto path = fs::path(m_settings.path()) / m_settings.cycle_format().date_from_cycle(cycle);

    boost::system::error_code err;
    fs::directory_iterator begin(path, err);
    fs::directory_iterator end;

    const auto data_prefix = (util::streamer() << DATA_FILE_NAME_PREFIX << thread_id << '-').str();

    for(const auto & entry : boost::make_iterator_range(begin, end))
    {
        auto name = entry.path().filename().native();
        if(boost::algorithm::starts_with(name, data_prefix))
        {
            std::int32_t index = -1;
            util::parse_number(name.begin() + (std::int32_t)data_prefix.size(), name.end(), index);
            if(last_number < index)
                last_number = index;
        }
    }
    // Move to the next data file
    return last_number + 1;

}